

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

uint8_t mpack_node_u8(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_data_t *pmVar2;
  mpack_node_t node_local;
  
  pmVar2 = node.data;
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if (pmVar2->type == mpack_type_uint) {
      if ((pmVar2->value).u < 0x100) {
        return (pmVar2->value).b;
      }
    }
    else if (((pmVar2->type == mpack_type_int) && (-1 < (pmVar2->value).i)) &&
            ((pmVar2->value).i < 0x100)) {
      return (pmVar2->value).b;
    }
    mpack_node_flag_error(node,mpack_error_type);
  }
  return '\0';
}

Assistant:

MPACK_INLINE uint8_t mpack_node_u8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT8_MAX)
            return (uint8_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT8_MAX)
            return (uint8_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}